

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sslexeme.cpp
# Opt level: O3

int IsStringInt(char *str)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  
  uVar2 = 0;
  if ((str != (char *)0x0) && (*str != '\0')) {
    sVar3 = strlen(str);
    uVar2 = 1;
    if (sVar3 != 0) {
      sVar5 = 0;
      do {
        if (str[sVar5] != '-' && 9 < (byte)(str[sVar5] - 0x30U)) {
          return 0;
        }
        sVar5 = sVar5 + 1;
      } while (sVar3 != sVar5);
      if ((sVar3 != 1) && (uVar2 = 0, str[1] != '-')) {
        uVar1 = 2;
        do {
          uVar4 = uVar1;
          if (sVar3 == uVar4) break;
          uVar1 = uVar4 + 1;
        } while (str[uVar4] != '-');
        uVar2 = (uint)(sVar3 <= uVar4);
      }
    }
  }
  return uVar2;
}

Assistant:

int IsStringInt(const char* str)
{
    if (!str)
        return FALSE;

    if (strlen(str) == 0)
        return FALSE;

    for (int i = 0; i < strlen(str); i++)
    {
        if (!IsCharNumeric(str[i]) && str[i] != '-')
            return FALSE;
    }

    for (int i = 1; i < strlen(str); i++)
    {
        if (str[i] == '-')
            return FALSE;
    }

	return TRUE;
}